

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void aGLFramebufferDestroy(AGLFramebuffer fbo)

{
  AGLFramebuffer AVar1;
  GLenum error;
  bool bVar2;
  GLuint GStack_10;
  GLenum glerror;
  AGLFramebuffer fbo_local;
  
  GStack_10 = fbo.name;
  AVar1 = fbo;
  if (GStack_10 != 0) {
    bVar2 = GStack_10 == a__gl_state.framebuffer.binding;
    _GStack_10 = fbo;
    if (bVar2) {
      a__gl_state.framebuffer.binding = 0;
      glBindFramebuffer(0x8d40,0);
      error = glGetError();
      if (error != 0) {
        a__GlPrintError("/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1411: glBindFramebuffer(GL_FRAMEBUFFER, a__gl_state.framebuffer.binding = 0) returned "
                        ,error);
        abort();
      }
    }
    glDeleteFramebuffers(1,&stack0xfffffffffffffff0);
    AVar1 = _GStack_10;
  }
  _GStack_10 = AVar1;
  if (glerror != 0) {
    glDeleteRenderbuffers(1,&glerror);
  }
  return;
}

Assistant:

void aGLFramebufferDestroy(AGLFramebuffer fbo) {
	if (fbo.name) {
		if (fbo.name == a__gl_state.framebuffer.binding)
			AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, a__gl_state.framebuffer.binding = 0));
		glDeleteFramebuffers(1, &fbo.name);
	}

	if (fbo.depth_renderbuffer)
		glDeleteRenderbuffers(1, &fbo.depth_renderbuffer);
}